

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_sign.c
# Opt level: O0

int DSA_verify(int type,uchar *dgst,int dgst_len,uchar *sigbuf,int siglen,DSA *dsa)

{
  int iVar1;
  DSA_SIG *pDVar2;
  int ret;
  int derlen;
  uchar *der;
  uchar *p;
  DSA_SIG *s;
  int in_stack_ffffffffffffffac;
  int iVar3;
  int iVar4;
  uchar *__s2;
  DSA_SIG *local_38;
  DSA *local_30;
  int local_24;
  uchar *local_20;
  int local_14;
  uchar *local_10;
  int local_8;
  int local_4;
  
  __s2 = (uchar *)0x0;
  iVar4 = -1;
  iVar3 = -1;
  local_30 = dsa;
  local_24 = siglen;
  local_20 = sigbuf;
  local_14 = dgst_len;
  local_10 = dgst;
  local_8 = type;
  local_38 = DSA_SIG_new();
  local_4 = iVar3;
  if (local_38 != (DSA_SIG *)0x0) {
    pDVar2 = d2i_DSA_SIG(&local_38,(uchar **)&stack0xffffffffffffffc0,(long)local_24);
    if (((pDVar2 != (DSA_SIG *)0x0) &&
        (iVar4 = i2d_DSA_SIG(local_38,(uchar **)&stack0xffffffffffffffb8), iVar4 == local_24)) &&
       (iVar1 = memcmp(local_20,__s2,(long)iVar4), iVar1 == 0)) {
      iVar3 = DSA_do_verify(local_10,local_14,local_38,local_30);
    }
    CRYPTO_clear_free(sigbuf,(size_t)__s2,(char *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffac);
    DSA_SIG_free(local_38);
    local_4 = iVar3;
  }
  return local_4;
}

Assistant:

int DSA_verify(int type, const unsigned char *dgst, int dgst_len,
               const unsigned char *sigbuf, int siglen, DSA *dsa)
{
    DSA_SIG *s;
    const unsigned char *p = sigbuf;
    unsigned char *der = NULL;
    int derlen = -1;
    int ret = -1;

    s = DSA_SIG_new();
    if (s == NULL)
        return ret;
    if (d2i_DSA_SIG(&s, &p, siglen) == NULL)
        goto err;
    /* Ensure signature uses DER and doesn't have trailing garbage */
    derlen = i2d_DSA_SIG(s, &der);
    if (derlen != siglen || memcmp(sigbuf, der, derlen))
        goto err;
    ret = DSA_do_verify(dgst, dgst_len, s, dsa);
 err:
    OPENSSL_clear_free(der, derlen);
    DSA_SIG_free(s);
    return ret;
}